

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O3

void joypad_playback_callback(JoypadButtons *joyp,void *user_data)

{
  byte bVar1;
  Ticks ticks;
  JoypadChunk *pJVar2;
  ulong uVar3;
  JoypadState *pJVar4;
  JoypadState *pJVar5;
  long *plVar6;
  ulong *puVar7;
  JoypadStateIter JVar8;
  
  ticks = emulator_get_ticks(*user_data);
  pJVar5 = *(JoypadState **)((long)user_data + 0x18);
  uVar3 = pJVar5->ticks;
  if (ticks < uVar3) {
    JVar8 = joypad_find_state(*(JoypadBuffer **)((long)user_data + 8),ticks);
    pJVar5 = JVar8.state;
    pJVar2 = JVar8.chunk;
    *(JoypadStateIter *)((long)user_data + 0x10) = JVar8;
    if (((long)pJVar5 - (long)pJVar2->data >> 4) + 1U < pJVar2->size) {
      pJVar4 = pJVar5 + 1;
    }
    else {
      pJVar2 = pJVar2->next;
      if (pJVar2->size == 0) {
        pJVar4 = (JoypadState *)0x0;
      }
      else {
        pJVar4 = pJVar2->data;
      }
    }
    *(JoypadChunk **)((long)user_data + 0x20) = pJVar2;
    *(JoypadState **)((long)user_data + 0x28) = pJVar4;
    uVar3 = pJVar5->ticks;
  }
  if (ticks < uVar3) {
    __assert_fail("ticks >= playback->current.state->ticks",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c",
                  0x10f,"void joypad_playback_callback(struct JoypadButtons *, void *)");
  }
  puVar7 = *(ulong **)((long)user_data + 0x28);
  if (puVar7 != (ulong *)0x0) {
    do {
      pJVar5 = *(JoypadState **)((long)user_data + 0x18);
      if (ticks < *puVar7) goto LAB_0010ece9;
      if (*puVar7 < pJVar5->ticks) {
        __assert_fail("playback->next.state->ticks >= playback->current.state->ticks",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c"
                      ,0x112,"void joypad_playback_callback(struct JoypadButtons *, void *)");
      }
      *(undefined8 *)((long)user_data + 0x10) = *(undefined8 *)((long)user_data + 0x20);
      *(undefined8 *)((long)user_data + 0x18) = *(undefined8 *)((long)user_data + 0x28);
      plVar6 = *(long **)((long)user_data + 0x20);
      if (((long)puVar7 - *plVar6 >> 4) + 1U < (ulong)plVar6[1]) {
        puVar7 = puVar7 + 2;
      }
      else {
        plVar6 = (long *)plVar6[3];
        if (plVar6[1] == 0) {
          *(long **)((long)user_data + 0x20) = plVar6;
          *(undefined8 *)((long)user_data + 0x28) = 0;
          break;
        }
        puVar7 = (ulong *)*plVar6;
      }
      *(long **)((long)user_data + 0x20) = plVar6;
      *(ulong **)((long)user_data + 0x28) = puVar7;
    } while (puVar7 != (ulong *)0x0);
    pJVar5 = *(JoypadState **)((long)user_data + 0x18);
  }
LAB_0010ece9:
  bVar1 = pJVar5->buttons;
  joyp->down = (uint)(bVar1 >> 7);
  joyp->up = bVar1 >> 6 & TRUE;
  joyp->left = bVar1 >> 5 & TRUE;
  joyp->right = bVar1 >> 4 & TRUE;
  joyp->start = bVar1 >> 3 & TRUE;
  joyp->select = bVar1 >> 2 & TRUE;
  joyp->B = bVar1 >> 1 & TRUE;
  joyp->A = bVar1 & TRUE;
  return;
}

Assistant:

static void joypad_playback_callback(struct JoypadButtons* joyp,
                                     void* user_data) {
  Bool changed = FALSE;
  JoypadPlayback* playback = user_data;
  Ticks ticks = emulator_get_ticks(playback->e);
  if (ticks < playback->current.state->ticks) {
    playback->current = joypad_find_state(playback->buffer, ticks);
    playback->next = joypad_get_next_state(playback->current);
    changed = TRUE;
  }

  assert(ticks >= playback->current.state->ticks);

  while (playback->next.state && playback->next.state->ticks <= ticks) {
    assert(playback->next.state->ticks >= playback->current.state->ticks);
    playback->current = playback->next;
    playback->next = joypad_get_next_state(playback->next);
    changed = TRUE;
  }

#if DEBUG_JOYPAD_BUTTONS
  if (changed) {
    print_joypad_buttons(
        playback->current.state->ticks,
        joypad_unpack_buttons(playback->current.state->buttons));
  }
#else
  (void)changed;
#endif

  *joyp = joypad_unpack_buttons(playback->current.state->buttons);
}